

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O2

bool __thiscall
absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  StringConvertResult SVar1;
  FormatSinkImpl *sink;
  
  if ((arg._0_4_ & 0xff) == 0x13) {
    *(int *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),spec.precision_) = (int)this;
    SVar1.value = true;
  }
  else {
    sink = (FormatSinkImpl *)(2L << (arg.buf[0] & 0x3f));
    if (((ulong)sink & 0x9fffa) == 0) {
      SVar1.value = false;
    }
    else {
      SVar1 = str_format_internal::FormatConvertImpl
                        ((str_format_internal *)this,arg._0_4_,spec,sink);
    }
  }
  return (bool)(SVar1.value & 1);
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }